

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::InsertSecondChanceCompensation
          (LinearScan *this,Lifetime **branchRegContent,Lifetime **labelRegContent,
          BranchInstr *branchInstr,LabelInstr *labelInstr)

{
  IRKind IVar1;
  IRKind IVar2;
  OpCode OVar3;
  uint uVar4;
  Func *lifetime;
  Func *lifetime_00;
  Lifetime *pLVar5;
  Lifetime *lifetime_01;
  code *pcVar6;
  Lifetime *pLVar7;
  Loop *pLVar8;
  bool bVar9;
  bool bVar10;
  BOOLEAN BVar11;
  uint32 uVar12;
  Instr *pIVar13;
  undefined4 *puVar14;
  LabelInstr *pLVar15;
  BranchInstr *pBVar16;
  char *message;
  char *error;
  undefined8 unaff_RBX;
  long lVar17;
  ulong uVar18;
  Instr *this_00;
  uint lineNumber;
  RegNum reg_00;
  ulong uVar19;
  RegNum reg;
  Lifetime *local_1a8;
  Lifetime *tmpRegContent [33];
  LabelInstr *local_98;
  Instr *local_90;
  Loop *local_88;
  LabelInstr *local_80;
  BitVector local_78;
  BitVector thrashedRegs;
  Instr *local_68;
  Instr *local_60;
  LabelInstr *local_48;
  bool local_39;
  undefined4 local_38;
  uint local_34;
  
  pBVar16 = branchInstr;
  thrashedRegs.word = (Type)labelRegContent;
  pIVar13 = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  OVar3 = (branchInstr->super_Instr).m_opcode;
  if (OVar3 < ADD) {
    if (OVar3 != MultiBr) {
      pBVar16 = (BranchInstr *)CONCAT71((int7)((ulong)pBVar16 >> 8),1);
      local_38 = SUB84(pBVar16,0);
      if (OVar3 != Br) goto LAB_0058826a;
    }
LAB_00588167:
    if (pIVar13->m_kind == InstrKindBranch) {
      OVar3 = pIVar13->m_opcode;
      if (OVar3 < ADD) {
        if (OVar3 != MultiBr) {
          pBVar16 = (BranchInstr *)CONCAT71((int7)((ulong)pBVar16 >> 8),1);
          local_38 = SUB84(pBVar16,0);
          if (OVar3 != Br) goto LAB_0058826a;
        }
      }
      else {
        bVar9 = LowererMD::IsUnconditionalBranch(pIVar13);
        pBVar16 = (BranchInstr *)CONCAT71((int7)((ulong)pBVar16 >> 8),1);
        local_38 = SUB84(pBVar16,0);
        if (!bVar9) goto LAB_0058826a;
      }
    }
    bVar9 = branchInstr->m_branchTarget == (LabelInstr *)0x0;
    if (bVar9) {
      local_38 = (undefined4)CONCAT71((int7)((ulong)pBVar16 >> 8),1);
      if (branchInstr->m_isMultiBranch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        error = "(m_isMultiBranch)";
        message = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_00588248;
      }
    }
    else if (branchInstr->m_isMultiBranch == false) {
      local_38 = 0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      error = "(!m_isMultiBranch)";
      message = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_00588248:
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,lineNumber,error,message);
      if (!bVar10) goto LAB_00588b05;
      *puVar14 = 0;
      local_38 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar9);
    }
  }
  else {
    bVar9 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
    pBVar16 = (BranchInstr *)CONCAT71((int7)((ulong)pBVar16 >> 8),1);
    local_38 = SUB84(pBVar16,0);
    if (bVar9) goto LAB_00588167;
  }
LAB_0058826a:
  local_39 = false;
  local_90 = (branchInstr->super_Instr).m_prev;
  local_78.word = 0;
  local_98 = (LabelInstr *)branchInstr;
  if (this->regContent == branchRegContent) {
    if ((labelInstr->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
      if (!bVar9) goto LAB_00588b05;
      *puVar14 = 0;
    }
    local_88 = labelInstr->m_loop;
    js_memcpy_s(&local_1a8,0x108,this->regContent,0x108);
    AvoidCompensationConflicts
              (this,labelInstr,branchInstr,(Lifetime **)thrashedRegs.word,&local_1a8,
               (Instr **)&local_98,&local_90,(bool)(char)local_38,&local_39);
    uVar18 = (this->secondChanceRegs).word;
    local_48 = local_98;
    local_34 = (uint)CONCAT71((int7)((ulong)local_98 >> 8),local_39);
    local_68 = local_90;
    if (uVar18 != 0) {
      uVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      tmpRegContent[0x20] = (Lifetime *)__tls_get_addr(&PTR_01548f08);
      local_80 = labelInstr;
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19);
        pLVar5 = *(Lifetime **)(thrashedRegs.word + uVar19 * 8);
        lifetime_01 = tmpRegContent[uVar19 - 1];
        if (((lifetime_01 != (Lifetime *)0x0) &&
            (uVar4 = lifetime_01->start, uVar12 = IR::Instr::GetNumber(&labelInstr->super_Instr),
            uVar4 < uVar12)) &&
           (uVar4 = lifetime_01->lastAllocationStart,
           uVar12 = IR::Instr::GetNumber(&labelInstr->super_Instr), uVar12 < uVar4)) {
          if ((labelInstr->field_0x78 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pLVar7 = tmpRegContent[0x20];
            *(undefined4 *)&tmpRegContent[0x20]->sym = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
            if (!bVar9) goto LAB_00588b05;
            *(undefined4 *)&pLVar7->sym = 0;
            labelInstr = local_80;
          }
          BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((labelInstr->m_loop->regAlloc).liveOnBackEdgeSyms,
                              (lifetime_01->sym->super_Sym).m_id);
          if ((BVar11 != '\0') &&
             ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
              (lifetime_01->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>
              .super_SListNodeBase<Memory::ArenaAllocator>.next != &lifetime_01->defList)) {
            if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_68 = (labelInstr->super_Instr).m_prev;
              local_34 = (uint)CONCAT71((int7)((ulong)local_68 >> 8),1);
              local_48 = labelInstr;
            }
            InsertStores(this,lifetime_01,lifetime_01->reg,local_68);
          }
        }
        if (lifetime_01 != pLVar5) {
          bVar9 = NeedsLoopBackEdgeCompensation(this,lifetime_01,labelInstr);
          reg_00 = (RegNum)uVar19;
          if (bVar9) {
            if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_68 = (labelInstr->super_Instr).m_prev;
              local_34 = (uint)CONCAT71((int7)((ulong)local_68 >> 8),1);
              local_48 = labelInstr;
            }
            ReconcileRegContent(this,&local_1a8,(Lifetime **)thrashedRegs.word,branchInstr,
                                labelInstr,lifetime_01,reg_00,&local_78,&local_48->super_Instr,
                                local_68);
          }
          if (((((pLVar5 != (Lifetime *)0x0) && ((pLVar5->field_0x9c & 1) != 0)) &&
               (bVar9 = StackSym::IsConst(pLVar5->sym), !bVar9)) &&
              ((uVar4 = pLVar5->end, uVar12 = IR::Instr::GetNumber(&branchInstr->super_Instr),
               pLVar8 = local_88, uVar12 <= uVar4 &&
               (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                                   ((local_88->regAlloc).liveOnBackEdgeSyms,
                                    (pLVar5->sym->super_Sym).m_id), BVar11 != '\0')))) &&
             (bVar9 = ClearLoopExitIfRegUnused(this,pLVar5,reg_00,branchInstr,pLVar8), !bVar9)) {
            if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_68 = (labelInstr->super_Instr).m_prev;
              local_34 = (uint)CONCAT71((int7)((ulong)local_68 >> 8),1);
              local_48 = labelInstr;
            }
            ReconcileRegContent(this,&local_1a8,(Lifetime **)thrashedRegs.word,branchInstr,
                                labelInstr,pLVar5,reg_00,&local_78,&local_48->super_Instr,local_68);
          }
        }
        uVar18 = uVar18 & ~(1L << (uVar19 & 0x3f));
        uVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
      } while (uVar18 != 0);
    }
    pLVar8 = local_88;
    local_98 = local_48;
    local_39 = SUB41(local_34,0);
    local_90 = local_68;
    uVar18 = 1;
    do {
      pLVar5 = *(Lifetime **)(thrashedRegs.word + uVar18 * 8);
      if ((((pLVar5 != (Lifetime *)0x0) && (bVar9 = StackSym::IsConst(pLVar5->sym), !bVar9)) &&
          (pLVar5 != tmpRegContent[uVar18 - 1])) &&
         ((BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar18),
          (local_78.word >> (uVar18 & 0x3f) & 1) == 0 &&
          (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((pLVar8->regAlloc).liveOnBackEdgeSyms,(pLVar5->sym->super_Sym).m_id),
          BVar11 != '\0')))) {
        bVar9 = ClearLoopExitIfRegUnused(this,pLVar5,(RegNum)uVar18,branchInstr,pLVar8);
        if (!bVar9) {
          if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_68 = (labelInstr->super_Instr).m_prev;
            local_34 = (uint)CONCAT71((int7)((ulong)local_68 >> 8),1);
            local_48 = labelInstr;
          }
          ReconcileRegContent(this,&local_1a8,(Lifetime **)thrashedRegs.word,branchInstr,labelInstr,
                              pLVar5,(RegNum)uVar18,&local_78,&local_48->super_Instr,local_68);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x21);
    if ((local_34 & 1) != 0) {
      (local_88->regAlloc).hasAirLock = true;
    }
  }
  else {
    lVar17 = 0x76;
    local_34 = 0;
    local_80 = labelInstr;
    local_60 = local_90;
    local_48 = (LabelInstr *)branchInstr;
    do {
      lifetime = (Func *)branchRegContent[lVar17 + -0x75];
      lifetime_00 = (&this->func)[lVar17];
      if (lifetime_00 != lifetime) {
        if (lifetime_00 == (Func *)0x0 || lifetime != (Func *)0x0) {
          if ((((lifetime != (Func *)0x0) &&
               (((lifetime->lazyBailoutProperties).
                 super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 .bucketCount & 1) != 0)) &&
              (bVar9 = StackSym::IsConst((StackSym *)lifetime->m_alloc), !bVar9)) &&
             (uVar4 = *(uint32 *)((long)&lifetime->propertiesWrittenTo + 4),
             uVar12 = IR::Instr::GetNumber(&labelInstr->super_Instr), labelInstr = local_80,
             uVar12 < uVar4)) {
            if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
              InsertAirlock(this,branchInstr,local_80);
              local_60 = (labelInstr->super_Instr).m_prev;
              local_34 = (uint)CONCAT71((int7)((ulong)local_60 >> 8),1);
              local_48 = labelInstr;
            }
            ReconcileRegContent(this,branchRegContent,(Lifetime **)thrashedRegs.word,branchInstr,
                                labelInstr,(Lifetime *)lifetime,(char)lVar17 + 0x8b,&local_78,
                                &local_48->super_Instr,local_60);
          }
          if (lifetime_00 != (Func *)0x0) goto LAB_005883b6;
        }
        else {
          uVar4 = *(uint *)&lifetime_00->propertiesWrittenTo;
          uVar12 = IR::Instr::GetNumber(&branchInstr->super_Instr);
          if ((uVar4 <= uVar12) || ((labelInstr->super_Instr).m_opcode != GeneratorBailInLabel)) {
LAB_005883b6:
            bVar9 = StackSym::IsConst((StackSym *)lifetime_00->m_alloc);
            if ((!bVar9) &&
               (uVar4 = *(uint *)&lifetime_00->propertiesWrittenTo,
               uVar12 = IR::Instr::GetNumber(&branchInstr->super_Instr), uVar4 <= uVar12)) {
              if (((char)local_38 != '\0') && ((local_34 & 1) == 0)) {
                InsertAirlock(this,branchInstr,labelInstr);
                local_60 = (labelInstr->super_Instr).m_prev;
                local_34 = (uint)CONCAT71((int7)((ulong)local_60 >> 8),1);
                local_48 = labelInstr;
              }
              ReconcileRegContent(this,branchRegContent,(Lifetime **)thrashedRegs.word,branchInstr,
                                  labelInstr,(Lifetime *)lifetime_00,(char)lVar17 + 0x8b,&local_78,
                                  &local_48->super_Instr,local_60);
            }
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x96);
  }
  if ((local_34 & 1) != 0) {
    pIVar13 = (local_48->super_Instr).m_prev;
    IVar1 = pIVar13->m_kind;
    if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) {
      return;
    }
    IVar2 = (local_48->super_Instr).m_kind;
    if ((IVar2 != InstrKindProfiledLabel) && (IVar2 != InstrKindLabel)) {
      return;
    }
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00588b05;
      *puVar14 = 0;
    }
    if (((ulong)pIVar13[1].m_func & 2) == 0) {
      return;
    }
    IVar1 = (local_48->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00588b05;
      *puVar14 = 0;
    }
    if ((local_48->field_0x78 & 2) != 0) {
      return;
    }
    pIVar13 = (local_48->super_Instr).m_prev;
    this_00 = pIVar13;
    if ((pIVar13->m_kind != InstrKindLabel) && (pIVar13->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00588b05;
      *puVar14 = 0;
      this_00 = (local_48->super_Instr).m_prev;
    }
    if (((ulong)pIVar13[1].m_func & 2) != 0) {
      pLVar15 = IR::Instr::AsLabelInstr(this_00);
      pLVar15->field_0x78 = pLVar15->field_0x78 | 0x20;
      this_00 = (local_48->super_Instr).m_prev;
    }
    if ((this_00->m_kind != InstrKindLabel) && (this_00->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) {
LAB_00588b05:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar14 = 0;
    }
    *(byte *)&this_00[1].m_func = *(byte *)&this_00[1].m_func & 0xfd;
  }
  return;
}

Assistant:

void
LinearScan::InsertSecondChanceCompensation(Lifetime ** branchRegContent, Lifetime **labelRegContent,
                                           IR::BranchInstr *branchInstr, IR::LabelInstr *labelInstr)
{
    IR::Instr *prevInstr = branchInstr->GetPrevRealInstrOrLabel();
    bool needsAirlock = branchInstr->IsConditional() || (prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->IsConditional()) || branchInstr->IsMultiBranch();
    bool hasAirlock = false;
    IR::Instr *insertionInstr = branchInstr;
    IR::Instr *insertionStartInstr = branchInstr->m_prev;
    // For loop back-edge, we want to keep the insertionStartInstr before the branch as spill need to happen on all paths
    // Pass a dummy instr address to airLockBlock insertion code.
    BitVector thrashedRegs(0);
    bool isLoopBackEdge = (this->regContent == branchRegContent);
    Lifetime * tmpRegContent[RegNumCount];
    Lifetime **regContent = this->regContent;

    if (isLoopBackEdge)
    {
        Loop *loop = labelInstr->GetLoop();

        js_memcpy_s(&tmpRegContent, (RegNumCount * sizeof(Lifetime *)), this->regContent, sizeof(this->regContent));

        branchRegContent = tmpRegContent;
        regContent = tmpRegContent;

#if defined(_M_IX86) || defined(_M_X64)
        // Insert XCHG to avoid some conflicts for int regs
        // Note: no XCHG on ARM or SSE2.  We could however use 3 XOR on ARM...
        this->AvoidCompensationConflicts(labelInstr, branchInstr, labelRegContent, branchRegContent,
                                         &insertionInstr, &insertionStartInstr, needsAirlock, &hasAirlock);
#endif


        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // 1.  Insert Stores
            //          Lifetime starts before the loop
            //          Lifetime was re-allocated within the loop (i.e.: a load was most likely inserted)
            //          Lifetime is live on back-edge and has unsaved defs.

            if (lifetime && lifetime->start < labelInstr->GetNumber() && lifetime->lastAllocationStart > labelInstr->GetNumber()
                && (labelInstr->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
                && !lifetime->defList.Empty())
            {
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                // If the lifetime was second chance allocated inside the loop, there might
                // be spilled loads of this symbol in the loop.  Insert the stores.
                // We don't need to do this if the lifetime was re-allocated before the loop.
                //
                // Note that reg may not be equal to lifetime->reg because of inserted XCHG...
                this->InsertStores(lifetime, lifetime->reg, insertionStartInstr);
            }

            if (lifetime == labelLifetime)
            {
                continue;
            }

            // 2.   MOV labelReg/MEM, branchReg
            //          Move current register to match content at the top of the loop
            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                // MOV ESI, EAX
                // MOV EDI, ECX
                // MOV ECX, ESI
                // MOV EAX, EDI <<<
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }

            // 2.   MOV labelReg, MEM
            //          Lifetime was in a reg at the top of the loop but is spilled right now.
            if (labelLifetime && labelLifetime->isSpilled && !labelLifetime->sym->IsConst() && labelLifetime->end >= branchInstr->GetNumber())
            {
                if (!loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id))
                {
                    continue;
                }
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_BITSET_IN_UNITBV;

        // 3.   MOV labelReg, MEM
        //          Finish up reloading lifetimes needed at the top.  #2 only handled secondChanceRegs.

        FOREACH_REG(reg)
        {
            // Handle lifetimes in a register at the top of the loop, but not currently.
            Lifetime *labelLifetime = labelRegContent[reg];
            if (labelLifetime && !labelLifetime->sym->IsConst() && labelLifetime != branchRegContent[reg] && !thrashedRegs.Test(reg)
                && (loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id)))
            {
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                            labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;

        if (hasAirlock)
        {
            loop->regAlloc.hasAirLock = true;
        }
    }
    else
    {
        //
        // Non-loop-back-edge merge
        //
        FOREACH_REG(reg)
        {
            Lifetime *branchLifetime = branchRegContent[reg];
            Lifetime *lifetime = regContent[reg];

            if (lifetime == branchLifetime)
            {
                continue;
            }

            // Allow us to properly insert compensation code for symbols whose lifetimes start after the generator jump table
            // The GeneratorBailInLabel will have 2 edges in: one from the normal flow, one straight from the generator jump table
            if (!branchLifetime && lifetime && lifetime->start > branchInstr->GetNumber() && labelInstr->m_opcode == Js::OpCode::GeneratorBailInLabel)
            {
                continue;
            }

            if (branchLifetime && branchLifetime->isSpilled && !branchLifetime->sym->IsConst() && branchLifetime->end > labelInstr->GetNumber())
            {
                // The lifetime was in a reg at the branch and is now spilled.  We need a store on this path.
                //
                //  MOV  MEM, branch_REG
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          branchLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
            if (lifetime && !lifetime->sym->IsConst() && lifetime->start <= branchInstr->GetNumber())
            {
                // MOV  label_REG, branch_REG / MEM
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;
    }

    if (hasAirlock)
    {
        // Fix opHelper on airlock label.
        if (insertionInstr->m_prev->IsLabelInstr() && insertionInstr->IsLabelInstr())
        {
            if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper && !insertionInstr->AsLabelInstr()->isOpHelper)
            {
                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Currently we would mark this block as a non-helper, but that makes
                // this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper)
                {
                    insertionInstr->m_prev->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                insertionInstr->m_prev->AsLabelInstr()->isOpHelper = false;
            }
        }
    }
}